

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<kj::CappedArray<char,_5UL>_>::~Array(Array<kj::CappedArray<char,_5UL>_> *this)

{
  CappedArray<char,_5UL> *pCVar1;
  size_t sVar2;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CappedArray<char,_5UL> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (CappedArray<char,_5UL> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pCVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }